

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
flatten_projection::evaluate
          (flatten_projection *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  bool bVar1;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  iterator iVar2;
  reference pbVar3;
  reference pbVar4;
  reference elem;
  const_array_range_type cVar5;
  reference local_48;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_40;
  iterator local_38;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(val);
  if (bVar1) {
    this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
              eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
              ::create_json<jsoncons::json_array_arg_t_const&>
                        ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                          *)context,(json_array_arg_t *)&json_array_arg);
    cVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(val);
    while (local_38 = cVar5.last_._M_current, iVar2 = cVar5.first_._M_current,
          iVar2._M_current != local_38._M_current) {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                        (iVar2._M_current);
      local_40 = iVar2._M_current;
      if (bVar1) {
        cVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                          (iVar2._M_current);
        for (iVar2 = cVar5.first_._M_current; iVar2._M_current != cVar5.last_._M_current._M_current;
            iVar2._M_current = iVar2._M_current + 1) {
          bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                            (iVar2._M_current);
          if (!bVar1) {
            pbVar3 = projection_base::apply_expressions
                               (&this->super_projection_base,iVar2._M_current,context,ec);
            bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                              (pbVar3);
            if (!bVar1) {
              local_48 = pbVar3;
              basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
              emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                        (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_48);
            }
          }
        }
      }
      else {
        bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                          (iVar2._M_current);
        if (!bVar1) {
          pbVar3 = projection_base::apply_expressions
                             (&this->super_projection_base,local_40,context,ec);
          bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null(pbVar3);
          if (!bVar1) {
            local_48 = pbVar3;
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                      (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_48);
          }
        }
      }
      cVar5.last_._M_current = local_38._M_current;
      cVar5.first_._M_current = local_40 + 1;
    }
    return (reference)this_00;
  }
  pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar4;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_array())
                {
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);
                for (reference current_elem : val.array_range())
                {
                    if (current_elem.is_array())
                    {
                        for (reference elem : current_elem.array_range())
                        {
                            if (!elem.is_null())
                            {
                                reference j = this->apply_expressions(elem, context, ec);
                                if (!j.is_null())
                                {
                                    result->emplace_back(json_const_pointer_arg, std::addressof(j));
                                }
                            }
                        }
                    }
                    else
                    {
                        if (!current_elem.is_null())
                        {
                            reference j = this->apply_expressions(current_elem, context, ec);
                            if (!j.is_null())
                            {
                                result->emplace_back(json_const_pointer_arg, std::addressof(j));
                            }
                        }
                    }
                }
                return *result;
            }